

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int unicodeCreate(int nArg,char **azArg,sqlite3_tokenizer **pp)

{
  long *__s;
  int iVar1;
  unicode_tokenizer *p_00;
  size_t sVar2;
  ulong uVar3;
  int iVar4;
  unicode_tokenizer *p;
  bool bVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  
  iVar1 = sqlite3_initialize();
  iVar4 = 7;
  if ((iVar1 == 0) &&
     (p_00 = (unicode_tokenizer *)sqlite3Malloc(0x18), p_00 != (unicode_tokenizer *)0x0)) {
    p_00->base = (sqlite3_tokenizer_module *)0x0;
    p_00->eRemoveDiacritic = 0;
    p_00->nException = 0;
    p_00->aiException = (int *)0x0;
    p_00->eRemoveDiacritic = 1;
    if (nArg < 1) {
      iVar4 = 0;
    }
    else {
      uVar3 = 1;
      do {
        __s = (long *)azArg[uVar3 - 1];
        sVar2 = strlen((char *)__s);
        iVar1 = (int)sVar2;
        if (iVar1 == 0x13) {
          auVar9[0] = -(*(char *)((long)__s + 3) == 'o');
          auVar9[1] = -(*(char *)((long)__s + 4) == 'v');
          auVar9[2] = -(*(char *)((long)__s + 5) == 'e');
          auVar9[3] = -(*(char *)((long)__s + 6) == '_');
          auVar9[4] = -(*(char *)((long)__s + 7) == 'd');
          auVar9[5] = -((char)__s[1] == 'i');
          auVar9[6] = -(*(char *)((long)__s + 9) == 'a');
          auVar9[7] = -(*(char *)((long)__s + 10) == 'c');
          auVar9[8] = -(*(char *)((long)__s + 0xb) == 'r');
          auVar9[9] = -(*(char *)((long)__s + 0xc) == 'i');
          auVar9[10] = -(*(char *)((long)__s + 0xd) == 't');
          auVar9[0xb] = -(*(char *)((long)__s + 0xe) == 'i');
          auVar9[0xc] = -(*(char *)((long)__s + 0xf) == 'c');
          auVar9[0xd] = -((char)__s[2] == 's');
          auVar9[0xe] = -(*(char *)((long)__s + 0x11) == '=');
          auVar9[0xf] = -(*(char *)((long)__s + 0x12) == '1');
          auVar6[0] = -((char)*__s == 'r');
          auVar6[1] = -(*(char *)((long)__s + 1) == 'e');
          auVar6[2] = -(*(char *)((long)__s + 2) == 'm');
          auVar6[3] = -(*(char *)((long)__s + 3) == 'o');
          auVar6[4] = -(*(char *)((long)__s + 4) == 'v');
          auVar6[5] = -(*(char *)((long)__s + 5) == 'e');
          auVar6[6] = -(*(char *)((long)__s + 6) == '_');
          auVar6[7] = -(*(char *)((long)__s + 7) == 'd');
          auVar6[8] = -((char)__s[1] == 'i');
          auVar6[9] = -(*(char *)((long)__s + 9) == 'a');
          auVar6[10] = -(*(char *)((long)__s + 10) == 'c');
          auVar6[0xb] = -(*(char *)((long)__s + 0xb) == 'r');
          auVar6[0xc] = -(*(char *)((long)__s + 0xc) == 'i');
          auVar6[0xd] = -(*(char *)((long)__s + 0xd) == 't');
          auVar6[0xe] = -(*(char *)((long)__s + 0xe) == 'i');
          auVar6[0xf] = -(*(char *)((long)__s + 0xf) == 'c');
          auVar6 = auVar6 & auVar9;
          if ((ushort)((ushort)(SUB161(auVar6 >> 7,0) & 1) |
                       (ushort)(SUB161(auVar6 >> 0xf,0) & 1) << 1 |
                       (ushort)(SUB161(auVar6 >> 0x17,0) & 1) << 2 |
                       (ushort)(SUB161(auVar6 >> 0x1f,0) & 1) << 3 |
                       (ushort)(SUB161(auVar6 >> 0x27,0) & 1) << 4 |
                       (ushort)(SUB161(auVar6 >> 0x2f,0) & 1) << 5 |
                       (ushort)(SUB161(auVar6 >> 0x37,0) & 1) << 6 |
                       (ushort)(SUB161(auVar6 >> 0x3f,0) & 1) << 7 |
                       (ushort)(SUB161(auVar6 >> 0x47,0) & 1) << 8 |
                       (ushort)(SUB161(auVar6 >> 0x4f,0) & 1) << 9 |
                       (ushort)(SUB161(auVar6 >> 0x57,0) & 1) << 10 |
                       (ushort)(SUB161(auVar6 >> 0x5f,0) & 1) << 0xb |
                       (ushort)(SUB161(auVar6 >> 0x67,0) & 1) << 0xc |
                       (ushort)(SUB161(auVar6 >> 0x6f,0) & 1) << 0xd |
                       (ushort)(SUB161(auVar6 >> 0x77,0) & 1) << 0xe |
                      (ushort)(byte)(auVar6[0xf] >> 7) << 0xf) == 0xffff) {
            p_00->eRemoveDiacritic = 1;
          }
          else {
            auVar10[0] = -(*(char *)((long)__s + 3) == 'o');
            auVar10[1] = -(*(char *)((long)__s + 4) == 'v');
            auVar10[2] = -(*(char *)((long)__s + 5) == 'e');
            auVar10[3] = -(*(char *)((long)__s + 6) == '_');
            auVar10[4] = -(*(char *)((long)__s + 7) == 'd');
            auVar10[5] = -((char)__s[1] == 'i');
            auVar10[6] = -(*(char *)((long)__s + 9) == 'a');
            auVar10[7] = -(*(char *)((long)__s + 10) == 'c');
            auVar10[8] = -(*(char *)((long)__s + 0xb) == 'r');
            auVar10[9] = -(*(char *)((long)__s + 0xc) == 'i');
            auVar10[10] = -(*(char *)((long)__s + 0xd) == 't');
            auVar10[0xb] = -(*(char *)((long)__s + 0xe) == 'i');
            auVar10[0xc] = -(*(char *)((long)__s + 0xf) == 'c');
            auVar10[0xd] = -((char)__s[2] == 's');
            auVar10[0xe] = -(*(char *)((long)__s + 0x11) == '=');
            auVar10[0xf] = -(*(char *)((long)__s + 0x12) == '0');
            auVar7[0] = -((char)*__s == 'r');
            auVar7[1] = -(*(char *)((long)__s + 1) == 'e');
            auVar7[2] = -(*(char *)((long)__s + 2) == 'm');
            auVar7[3] = -(*(char *)((long)__s + 3) == 'o');
            auVar7[4] = -(*(char *)((long)__s + 4) == 'v');
            auVar7[5] = -(*(char *)((long)__s + 5) == 'e');
            auVar7[6] = -(*(char *)((long)__s + 6) == '_');
            auVar7[7] = -(*(char *)((long)__s + 7) == 'd');
            auVar7[8] = -((char)__s[1] == 'i');
            auVar7[9] = -(*(char *)((long)__s + 9) == 'a');
            auVar7[10] = -(*(char *)((long)__s + 10) == 'c');
            auVar7[0xb] = -(*(char *)((long)__s + 0xb) == 'r');
            auVar7[0xc] = -(*(char *)((long)__s + 0xc) == 'i');
            auVar7[0xd] = -(*(char *)((long)__s + 0xd) == 't');
            auVar7[0xe] = -(*(char *)((long)__s + 0xe) == 'i');
            auVar7[0xf] = -(*(char *)((long)__s + 0xf) == 'c');
            auVar7 = auVar7 & auVar10;
            if ((ushort)((ushort)(SUB161(auVar7 >> 7,0) & 1) |
                         (ushort)(SUB161(auVar7 >> 0xf,0) & 1) << 1 |
                         (ushort)(SUB161(auVar7 >> 0x17,0) & 1) << 2 |
                         (ushort)(SUB161(auVar7 >> 0x1f,0) & 1) << 3 |
                         (ushort)(SUB161(auVar7 >> 0x27,0) & 1) << 4 |
                         (ushort)(SUB161(auVar7 >> 0x2f,0) & 1) << 5 |
                         (ushort)(SUB161(auVar7 >> 0x37,0) & 1) << 6 |
                         (ushort)(SUB161(auVar7 >> 0x3f,0) & 1) << 7 |
                         (ushort)(SUB161(auVar7 >> 0x47,0) & 1) << 8 |
                         (ushort)(SUB161(auVar7 >> 0x4f,0) & 1) << 9 |
                         (ushort)(SUB161(auVar7 >> 0x57,0) & 1) << 10 |
                         (ushort)(SUB161(auVar7 >> 0x5f,0) & 1) << 0xb |
                         (ushort)(SUB161(auVar7 >> 0x67,0) & 1) << 0xc |
                         (ushort)(SUB161(auVar7 >> 0x6f,0) & 1) << 0xd |
                         (ushort)(SUB161(auVar7 >> 0x77,0) & 1) << 0xe |
                        (ushort)(byte)(auVar7[0xf] >> 7) << 0xf) == 0xffff) {
              p_00->eRemoveDiacritic = 0;
            }
            else {
              auVar11[0] = -(*(char *)((long)__s + 3) == 'o');
              auVar11[1] = -(*(char *)((long)__s + 4) == 'v');
              auVar11[2] = -(*(char *)((long)__s + 5) == 'e');
              auVar11[3] = -(*(char *)((long)__s + 6) == '_');
              auVar11[4] = -(*(char *)((long)__s + 7) == 'd');
              auVar11[5] = -((char)__s[1] == 'i');
              auVar11[6] = -(*(char *)((long)__s + 9) == 'a');
              auVar11[7] = -(*(char *)((long)__s + 10) == 'c');
              auVar11[8] = -(*(char *)((long)__s + 0xb) == 'r');
              auVar11[9] = -(*(char *)((long)__s + 0xc) == 'i');
              auVar11[10] = -(*(char *)((long)__s + 0xd) == 't');
              auVar11[0xb] = -(*(char *)((long)__s + 0xe) == 'i');
              auVar11[0xc] = -(*(char *)((long)__s + 0xf) == 'c');
              auVar11[0xd] = -((char)__s[2] == 's');
              auVar11[0xe] = -(*(char *)((long)__s + 0x11) == '=');
              auVar11[0xf] = -(*(char *)((long)__s + 0x12) == '2');
              auVar8[0] = -((char)*__s == 'r');
              auVar8[1] = -(*(char *)((long)__s + 1) == 'e');
              auVar8[2] = -(*(char *)((long)__s + 2) == 'm');
              auVar8[3] = -(*(char *)((long)__s + 3) == 'o');
              auVar8[4] = -(*(char *)((long)__s + 4) == 'v');
              auVar8[5] = -(*(char *)((long)__s + 5) == 'e');
              auVar8[6] = -(*(char *)((long)__s + 6) == '_');
              auVar8[7] = -(*(char *)((long)__s + 7) == 'd');
              auVar8[8] = -((char)__s[1] == 'i');
              auVar8[9] = -(*(char *)((long)__s + 9) == 'a');
              auVar8[10] = -(*(char *)((long)__s + 10) == 'c');
              auVar8[0xb] = -(*(char *)((long)__s + 0xb) == 'r');
              auVar8[0xc] = -(*(char *)((long)__s + 0xc) == 'i');
              auVar8[0xd] = -(*(char *)((long)__s + 0xd) == 't');
              auVar8[0xe] = -(*(char *)((long)__s + 0xe) == 'i');
              auVar8[0xf] = -(*(char *)((long)__s + 0xf) == 'c');
              auVar8 = auVar8 & auVar11;
              if ((ushort)((ushort)(SUB161(auVar8 >> 7,0) & 1) |
                           (ushort)(SUB161(auVar8 >> 0xf,0) & 1) << 1 |
                           (ushort)(SUB161(auVar8 >> 0x17,0) & 1) << 2 |
                           (ushort)(SUB161(auVar8 >> 0x1f,0) & 1) << 3 |
                           (ushort)(SUB161(auVar8 >> 0x27,0) & 1) << 4 |
                           (ushort)(SUB161(auVar8 >> 0x2f,0) & 1) << 5 |
                           (ushort)(SUB161(auVar8 >> 0x37,0) & 1) << 6 |
                           (ushort)(SUB161(auVar8 >> 0x3f,0) & 1) << 7 |
                           (ushort)(SUB161(auVar8 >> 0x47,0) & 1) << 8 |
                           (ushort)(SUB161(auVar8 >> 0x4f,0) & 1) << 9 |
                           (ushort)(SUB161(auVar8 >> 0x57,0) & 1) << 10 |
                           (ushort)(SUB161(auVar8 >> 0x5f,0) & 1) << 0xb |
                           (ushort)(SUB161(auVar8 >> 0x67,0) & 1) << 0xc |
                           (ushort)(SUB161(auVar8 >> 0x6f,0) & 1) << 0xd |
                           (ushort)(SUB161(auVar8 >> 0x77,0) & 1) << 0xe |
                          (ushort)(byte)(auVar8[0xf] >> 7) << 0xf) != 0xffff) goto LAB_001b3992;
              p_00->eRemoveDiacritic = 2;
            }
          }
          iVar4 = 0;
        }
        else {
          if (iVar1 < 0xb) {
LAB_001b3a41:
            iVar4 = 1;
            goto LAB_001b3a46;
          }
LAB_001b3992:
          if (*(long *)((long)__s + 3) == 0x3d73726168636e65 && *__s == 0x6168636e656b6f74) {
            iVar4 = 1;
          }
          else {
            if (*(long *)((long)__s + 3) != 0x3d73726f74617261 || *__s != 0x6f74617261706573)
            goto LAB_001b3a41;
            iVar4 = 0;
          }
          iVar4 = unicodeAddExceptions(p_00,iVar4,(char *)((long)__s + 0xb),iVar1 + -0xb);
        }
      } while ((iVar4 == 0) && (bVar5 = uVar3 < (uint)nArg, uVar3 = uVar3 + 1, bVar5));
      if (iVar4 == 0) {
        iVar4 = 0;
      }
      else {
LAB_001b3a46:
        sqlite3_free(p_00->aiException);
        sqlite3_free(p_00);
        p_00 = (unicode_tokenizer *)0x0;
      }
    }
    *pp = &p_00->base;
  }
  return iVar4;
}

Assistant:

static int unicodeCreate(
  int nArg,                       /* Size of array argv[] */
  const char * const *azArg,      /* Tokenizer creation arguments */
  sqlite3_tokenizer **pp          /* OUT: New tokenizer handle */
){
  unicode_tokenizer *pNew;        /* New tokenizer object */
  int i;
  int rc = SQLITE_OK;

  pNew = (unicode_tokenizer *) sqlite3_malloc(sizeof(unicode_tokenizer));
  if( pNew==NULL ) return SQLITE_NOMEM;
  memset(pNew, 0, sizeof(unicode_tokenizer));
  pNew->eRemoveDiacritic = 1;

  for(i=0; rc==SQLITE_OK && i<nArg; i++){
    const char *z = azArg[i];
    int n = (int)strlen(z);

    if( n==19 && memcmp("remove_diacritics=1", z, 19)==0 ){
      pNew->eRemoveDiacritic = 1;
    }
    else if( n==19 && memcmp("remove_diacritics=0", z, 19)==0 ){
      pNew->eRemoveDiacritic = 0;
    }
    else if( n==19 && memcmp("remove_diacritics=2", z, 19)==0 ){
      pNew->eRemoveDiacritic = 2;
    }
    else if( n>=11 && memcmp("tokenchars=", z, 11)==0 ){
      rc = unicodeAddExceptions(pNew, 1, &z[11], n-11);
    }
    else if( n>=11 && memcmp("separators=", z, 11)==0 ){
      rc = unicodeAddExceptions(pNew, 0, &z[11], n-11);
    }
    else{
      /* Unrecognized argument */
      rc  = SQLITE_ERROR;
    }
  }

  if( rc!=SQLITE_OK ){
    unicodeDestroy((sqlite3_tokenizer *)pNew);
    pNew = 0;
  }
  *pp = (sqlite3_tokenizer *)pNew;
  return rc;
}